

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t assertion_empty_file(char *filename,wchar_t line,char *f1)

{
  int iVar1;
  char *__stream;
  size_t sVar2;
  wchar_t wVar3;
  stat st;
  char buff [1024];
  stat sStack_4b8;
  char local_428 [1032];
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = stat(f1,&sStack_4b8);
  if (iVar1 == 0) {
    if (sStack_4b8.st_size == 0) {
      wVar3 = L'\x01';
    }
    else {
      failure_start(filename,line,"File should be empty: %s",f1);
      logprintf("    File size: %d\n",sStack_4b8.st_size & 0xffffffff);
      logprintf("    Contents:\n");
      __stream = (char *)fopen(f1,"rb");
      if ((FILE *)__stream == (FILE *)0x0) {
        __stream = "    Unable to open %s\n";
        logprintf("    Unable to open %s\n",f1);
      }
      else {
        sVar2 = 0x400;
        if (sStack_4b8.st_size < 0x400) {
          sVar2 = sStack_4b8.st_size;
        }
        sVar2 = fread(local_428,1,sVar2,(FILE *)__stream);
        hexdump(local_428,(char *)0x0,sVar2,0);
        fclose((FILE *)__stream);
      }
      failure_finish(__stream);
      wVar3 = L'\0';
    }
  }
  else {
    wVar3 = L'\0';
    failure_start(filename,line,"Stat failed: %s",f1);
    failure_finish(filename);
  }
  return wVar3;
}

Assistant:

int
assertion_empty_file(const char *filename, int line, const char *f1)
{
	char buff[1024];
	struct stat st;
	ssize_t s;
	FILE *f;

	assertion_count(filename, line);

	if (stat(f1, &st) != 0) {
		failure_start(filename, line, "Stat failed: %s", f1);
		failure_finish(NULL);
		return (0);
	}
	if (st.st_size == 0)
		return (1);

	failure_start(filename, line, "File should be empty: %s", f1);
	logprintf("    File size: %d\n", (int)st.st_size);
	logprintf("    Contents:\n");
	f = fopen(f1, "rb");
	if (f == NULL) {
		logprintf("    Unable to open %s\n", f1);
	} else {
		s = ((off_t)sizeof(buff) < st.st_size) ?
		    (ssize_t)sizeof(buff) : (ssize_t)st.st_size;
		s = fread(buff, 1, s, f);
		hexdump(buff, NULL, s, 0);
		fclose(f);
	}
	failure_finish(NULL);
	return (0);
}